

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O0

void __thiscall
Assimp::IRRImporter::CopyMaterial
          (IRRImporter *this,vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials,
          vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
          *inmaterials,uint *defMatIdx,aiMesh *mesh)

{
  bool bVar1;
  size_type sVar2;
  Logger *this_00;
  reference __x;
  aiMesh *mesh_local;
  uint *defMatIdx_local;
  vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
  *inmaterials_local;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials_local;
  IRRImporter *this_local;
  
  bVar1 = std::
          vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
          ::empty(inmaterials);
  if (bVar1) {
    if (*defMatIdx == 0xffffffff) {
      sVar2 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(materials);
      *defMatIdx = (uint)sVar2;
    }
    mesh->mMaterialIndex = *defMatIdx;
  }
  else {
    sVar2 = std::
            vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
            ::size(inmaterials);
    if (1 < sVar2) {
      this_00 = DefaultLogger::get();
      Logger::info(this_00,"IRR: Skipping additional materials");
    }
    sVar2 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(materials);
    mesh->mMaterialIndex = (uint)sVar2;
    __x = std::
          vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
          ::operator[](inmaterials,0);
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(materials,&__x->first);
  }
  return;
}

Assistant:

void IRRImporter::CopyMaterial(std::vector<aiMaterial*>& materials,
    std::vector< std::pair<aiMaterial*, unsigned int> >& inmaterials,
    unsigned int& defMatIdx,
    aiMesh* mesh)
{
    if (inmaterials.empty())    {
        // Do we have a default material? If not we need to create one
        if (UINT_MAX == defMatIdx)
        {
            defMatIdx = (unsigned int)materials.size();
            //TODO: add this materials to someone?
            /*aiMaterial* mat = new aiMaterial();

            aiString s;
            s.Set(AI_DEFAULT_MATERIAL_NAME);
            mat->AddProperty(&s,AI_MATKEY_NAME);

            aiColor3D c(0.6f,0.6f,0.6f);
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_DIFFUSE);*/
        }
        mesh->mMaterialIndex = defMatIdx;
        return;
    }
    else if (inmaterials.size() > 1)    {
        ASSIMP_LOG_INFO("IRR: Skipping additional materials");
    }

    mesh->mMaterialIndex = (unsigned int)materials.size();
    materials.push_back(inmaterials[0].first);
}